

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O0

void __thiscall
InitTermTestErrorHandler::fatalError(InitTermTestErrorHandler *this,SAXParseException *e)

{
  ostream *poVar1;
  XMLCh *pXVar2;
  ulong uVar3;
  StrX local_38 [3];
  StrX local_20;
  SAXParseException *local_18;
  SAXParseException *e_local;
  InitTermTestErrorHandler *this_local;
  
  this->fSawErrors = true;
  local_18 = e;
  e_local = (SAXParseException *)this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"\nFatal Error at file ");
  pXVar2 = (XMLCh *)xercesc_4_0::SAXParseException::getSystemId();
  StrX::StrX(&local_20,pXVar2);
  poVar1 = operator<<(poVar1,&local_20);
  poVar1 = std::operator<<(poVar1,", line ");
  uVar3 = xercesc_4_0::SAXParseException::getLineNumber();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  poVar1 = std::operator<<(poVar1,", char ");
  uVar3 = xercesc_4_0::SAXParseException::getColumnNumber();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  poVar1 = std::operator<<(poVar1,"\n  Message: ");
  pXVar2 = (XMLCh *)(**(code **)(*(long *)local_18 + 0x10))();
  StrX::StrX(local_38,pXVar2);
  poVar1 = operator<<(poVar1,local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  StrX::~StrX(local_38);
  StrX::~StrX(&local_20);
  return;
}

Assistant:

void InitTermTestErrorHandler::fatalError(const SAXParseException& e)
{
    fSawErrors = true;
    std::cerr << "\nFatal Error at file " << StrX(e.getSystemId())
         << ", line " << e.getLineNumber()
         << ", char " << e.getColumnNumber()
         << "\n  Message: " << StrX(e.getMessage()) << std::endl;
}